

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

String * __thiscall
Diligent::GetBindFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,Uint32 BindFlags,char *Delimiter)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  string msg;
  undefined4 local_48;
  Uint32 in_stack_ffffffffffffffbc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
  }
  else {
    uVar1 = (ulong)this & 0xffffffff;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar2 = 1;
    do {
      if ((uVar2 & (uint)uVar1) != 0) {
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        GetBindFlagString(in_stack_ffffffffffffffbc);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar1 = (ulong)((uint)uVar1 & ~uVar2);
      }
    } while (((int)uVar1 != 0) && (bVar3 = uVar2 < 0x401, uVar2 = uVar2 * 2, bVar3));
    if ((int)uVar1 != 0) {
      FormatString<char[24]>((string *)&local_48,(char (*) [24])"Unknown bind flags left");
      DebugAssertionFailed
                ((Char *)CONCAT44(in_stack_ffffffffffffffbc,local_48),"GetBindFlagsString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x4af);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(in_stack_ffffffffffffffbc,local_48) != &local_38) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(in_stack_ffffffffffffffbc,local_48),
                        local_38._M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetBindFlagsString(Uint32 BindFlags, const char* Delimiter)
{
    if (BindFlags == 0)
        return "0";
    String Str;
    for (Uint32 Flag = 1; BindFlags && Flag <= BIND_FLAG_LAST; Flag <<= 1)
    {
        if (BindFlags & Flag)
        {
            if (!Str.empty())
                Str += Delimiter;
            Str += GetBindFlagString(Flag);
            BindFlags &= ~Flag;
        }
    }
    VERIFY(BindFlags == 0, "Unknown bind flags left");
    return Str;
}